

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::mkdir(QFSFileEngine *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff88;
  QFileSystemEntry *this_00;
  QFileSystemEntry local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_48;
  QFileSystemEntry::QFileSystemEntry(this_00,&in_stack_ffffffffffffff88->m_filePath);
  bVar1 = QFileSystemEngine::createDirectory
                    (in_stack_ffffffffffffff88,false,
                     (optional<QFlags<QFileDevice::Permission>_>)this);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::mkdir(const QString &name, bool createParentDirectories,
                          std::optional<QFile::Permissions> permissions) const
{
    return QFileSystemEngine::createDirectory(QFileSystemEntry(name), createParentDirectories,
                                              permissions);
}